

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

bool __thiscall GoState<5U,_4U>::is_move_possible(GoState<5U,_4U> *this,int i,int j,int player)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  uint uVar4;
  uchar *puVar5;
  _Base_ptr p_Var6;
  byte bVar7;
  byte bVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  pieces;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  if ((uint)j < 4 && (uint)i < 5) {
    if (this->board[(uint)i][(uint)j] == '\0') {
      puVar5 = this->board[(uint)i] + (uint)j;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      *puVar5 = (uchar)player;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar2 = (*this->_vptr_GoState[9])(this,(ulong)(uint)i,(ulong)(uint)j,&local_60);
      bVar7 = 1;
      if (((((char)iVar2 == '\0') &&
           (((uVar4 = 3 - player, i < 1 || (uVar4 != this->board[i - 1][(uint)j])) ||
            (iVar2 = (*this->_vptr_GoState[9])(this,(ulong)(i - 1),(ulong)(uint)j,&local_60),
            (char)iVar2 != '\0')))) &&
          (((3 < (uint)i || (uVar4 != this->board[(ulong)(uint)i + 1][(uint)j])) ||
           (iVar2 = (*this->_vptr_GoState[9])(this,(ulong)(i + 1),(ulong)(uint)j,&local_60),
           (char)iVar2 != '\0')))) &&
         (((j < 1 || (uVar4 != this->board[(uint)i][j - 1])) ||
          (iVar2 = (*this->_vptr_GoState[9])(this,(ulong)(uint)i,(ulong)(j - 1),&local_60),
          (char)iVar2 != '\0')))) {
        if (((uint)j < 3) && (uVar4 == this->board[(uint)i][(ulong)(uint)j + 1])) {
          iVar2 = (*this->_vptr_GoState[9])(this,(ulong)(uint)i,(ulong)(j + 1),&local_60);
          bVar7 = (byte)iVar2 ^ 1;
        }
        else {
          bVar7 = 0;
        }
      }
      if (bVar7 != 0) {
        uVar4 = (*this->_vptr_GoState[4])(this);
        if (uVar4 == this->previous_board_hash_value) {
          bVar7 = 0;
        }
        else {
          _Var3 = (*this->_vptr_GoState[4])(this);
          p_Var1 = &(this->all_hash_values)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (this->all_hash_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 = &p_Var1->_M_header;
          for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar10]) {
            bVar10 = p_Var9[1]._M_color < _Var3;
            if (!bVar10) {
              p_Var6 = p_Var9;
            }
          }
          p_Var9 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var9 = p_Var6, _Var3 < p_Var6[1]._M_color)
             ) {
            p_Var9 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var9 != p_Var1) {
            bVar7 = 0;
          }
        }
      }
      bVar8 = bVar7;
      if (bVar7 != 0) {
        iVar2 = (*this->_vptr_GoState[7])(this,(ulong)(uint)i,(ulong)(uint)j,(ulong)(uint)player);
        bVar8 = 0;
        if ((char)iVar2 == '\0') {
          bVar8 = bVar7;
        }
      }
      *puVar5 = '\0';
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&local_60);
      return (bool)bVar8;
    }
  }
  return false;
}

Assistant:

virtual bool is_move_possible(const int i, const int j, const int player) const
	{
		const int opponent = 3 - player;

		if (0 <= i && i < M && 0 <= j && j < N) {
			if (board[i][j] != empty) {
				return false;
			}

			// See if it is possible to move into this empty place.
			std::set<std::pair<int, int>> pieces;
			board[i][j] = player;

			bool possible = false;
			if (is_alive(i, j, &pieces)) {
				// This stone is immediately alive.
				possible = true;
			}
			else {
				// This stone may have killed opponents so
				// that it is alive.

				if (i > 0 && board[i - 1][j] == opponent && !is_alive(i - 1, j, &pieces)) {
					possible = true;
				}
				else if (i < M - 1 && board[i + 1][j] == opponent && !is_alive(i + 1, j, &pieces)) {
					possible = true;
				}
				else if (j > 0 && board[i][j - 1] == opponent && !is_alive(i, j - 1, &pieces)) {
					possible = true;
				}
				else if (j < N - 1 && board[i][j + 1] == opponent && !is_alive(i, j + 1, &pieces)) {
					possible = true;
				}
			}

			if (possible) {
				// Ko rule tests.
				if (compute_hash_value() == previous_board_hash_value) {			
					possible = false;
				}
				else if (all_hash_values.find(compute_hash_value()) != all_hash_values.end()) {
					possible = false;
				}
			}

			if (possible) {
				// Not possible to play in one's own eye.
				if (is_eye(i, j, player)) {
					possible = false;
				}
			}

			board[i][j] = empty;
			return possible;
		}
		else {
			// Not a valid position.
			return false;
		}
	}